

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O2

void __thiscall MIDIplay::applySetup(MIDIplay *this)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  OPL3 *this_00;
  byte bVar5;
  byte bVar6;
  ADLMIDI_VolumeModels volumeModel;
  AdlChannel AStack_78;
  byte bVar7;
  
  this_00 = (this->m_synth).m_p;
  this_00->m_musicMode = MODE_MIDI;
  (this->m_setup).tick_skip_samples_delay = 0;
  this_00->m_runAtPcmRate = (this->m_setup).runAtPcmRate;
  if (this_00->m_embeddedBank == 0xffffffff) {
    bVar6 = (this_00->m_insBankSetup).deepTremolo;
    bVar5 = (this_00->m_insBankSetup).deepVibrato;
  }
  else {
    uVar1 = g_embeddedBanks[(this->m_setup).bankId].bankSetup;
    (this_00->m_insBankSetup).volumeModel = uVar1 & 0xff;
    bVar7 = (byte)(uVar1 >> 8);
    bVar6 = bVar7 & 1;
    (this_00->m_insBankSetup).deepTremolo = (bool)bVar6;
    bVar5 = bVar7 >> 1 & 1;
    (this_00->m_insBankSetup).deepVibrato = (bool)bVar5;
    (this_00->m_insBankSetup).mt32defaults = (bool)(bVar7 >> 2 & 1);
  }
  iVar2 = (this->m_setup).deepTremoloMode;
  bVar7 = iVar2 != 0;
  if (iVar2 < 0) {
    bVar7 = bVar6;
  }
  this_00->m_deepTremoloMode = (bool)(bVar7 & 1);
  iVar2 = (this->m_setup).deepVibratoMode;
  bVar6 = iVar2 != 0;
  if (iVar2 < 0) {
    bVar6 = bVar5;
  }
  this_00->m_deepVibratoMode = (bool)(bVar6 & 1);
  iVar2 = (this->m_setup).scaleModulators;
  bVar6 = iVar2 != 0;
  if (iVar2 < 0) {
    bVar6 = (this_00->m_insBankSetup).scaleModulators;
  }
  this_00->m_scaleModulators = (bool)(bVar6 & 1);
  if ((this->m_setup).logarithmicVolumes == false) {
    volumeModel = (this->m_setup).volumeScaleModel;
  }
  else {
    volumeModel = ADLMIDI_VolumeModel_CMF;
  }
  ::OPL3::setVolumeScaleModel(this_00,volumeModel);
  if ((this->m_setup).volumeScaleModel == 0) {
    this_00->m_volumeScale = (this_00->m_insBankSetup).volumeModel;
  }
  this_00->m_numChips = (this->m_setup).numChips;
  this->m_cmfPercussionMode = false;
  uVar3 = (this->m_setup).numFourOps;
  if ((int)uVar3 < 0) {
    adlCalculateFourOpChannels(this,true);
  }
  else {
    this_00->m_numFourOps = uVar3;
  }
  chipReset(this);
  std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::clear
            (&this->m_chipChannels);
  uVar4 = this_00->m_numChannels;
  AdlChannel::AdlChannel(&AStack_78);
  std::vector<MIDIplay::AdlChannel,_std::allocator<MIDIplay::AdlChannel>_>::resize
            (&this->m_chipChannels,(ulong)uVar4,&AStack_78);
  pl_list<MIDIplay::AdlChannel::LocationData>::~pl_list(&AStack_78.users);
  this->m_arpeggioCounter = 0;
  return;
}

Assistant:

void MIDIplay::applySetup()
{
    Synth &synth = *m_synth;

    synth.m_musicMode = Synth::MODE_MIDI;
    m_setup.tick_skip_samples_delay = 0;
    synth.m_runAtPcmRate = m_setup.runAtPcmRate;

#ifndef DISABLE_EMBEDDED_BANKS
    if(synth.m_embeddedBank != Synth::CustomBankTag)
    {
        const BanksDump::BankEntry &b = g_embeddedBanks[m_setup.bankId];
        synth.m_insBankSetup.volumeModel = (b.bankSetup & 0x00FF);
        synth.m_insBankSetup.deepTremolo = (b.bankSetup >> 8 & 0x0001) != 0;
        synth.m_insBankSetup.deepVibrato = (b.bankSetup >> 8 & 0x0002) != 0;
        synth.m_insBankSetup.mt32defaults = (b.bankSetup >> 8 & 0x0004) != 0;
    }
#endif

    synth.m_deepTremoloMode = m_setup.deepTremoloMode < 0 ?
                              synth.m_insBankSetup.deepTremolo :
                              (m_setup.deepTremoloMode != 0);
    synth.m_deepVibratoMode = m_setup.deepVibratoMode < 0 ?
                              synth.m_insBankSetup.deepVibrato :
                              (m_setup.deepVibratoMode != 0);
    synth.m_scaleModulators = m_setup.scaleModulators < 0 ?
                              synth.m_insBankSetup.scaleModulators :
                              (m_setup.scaleModulators != 0);

    if(m_setup.logarithmicVolumes)
        synth.setVolumeScaleModel(ADLMIDI_VolumeModel_NativeOPL3);
    else
        synth.setVolumeScaleModel(static_cast<ADLMIDI_VolumeModels>(m_setup.volumeScaleModel));

    if(m_setup.volumeScaleModel == ADLMIDI_VolumeModel_AUTO)//Use bank default volume model
        synth.m_volumeScale = (Synth::VolumesScale)synth.m_insBankSetup.volumeModel;

    synth.m_numChips    = m_setup.numChips;
    m_cmfPercussionMode = false;

    if(m_setup.numFourOps >= 0)
        synth.m_numFourOps  = m_setup.numFourOps;
    else
        adlCalculateFourOpChannels(this, true);

    chipReset();
    m_chipChannels.clear();
    m_chipChannels.resize(synth.m_numChannels);

    // Reset the arpeggio counter
    m_arpeggioCounter = 0;
}